

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void libcellml::clearComponentImports(ComponentPtr *component)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ComponentEntity local_28;
  
  bVar1 = ImportedEntity::isImport
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ImportedEntity);
  if (bVar1) {
    ImportedEntity::importSource
              (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ImportedEntity);
    ImportSource::removeModel
              ((ImportSource *)
               local_28.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_28.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_28.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
  }
  sVar2 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      ComponentEntity::component
                (&local_28,
                 (size_t)(component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      clearComponentImports((ComponentPtr *)&local_28);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_28.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_28.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      uVar3 = uVar3 + 1;
      sVar2 = ComponentEntity::componentCount
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ComponentEntity);
    } while (uVar3 < sVar2);
  }
  return;
}

Assistant:

void clearComponentImports(const ComponentPtr &component)
{
    if (component->isImport()) {
        component->importSource()->removeModel();
    }
    for (size_t c = 0; c < component->componentCount(); ++c) {
        clearComponentImports(component->component(c));
    }
}